

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboColorbufferTests.cpp
# Opt level: O3

void __thiscall
deqp::gles3::Functional::FboColorMultiTex2DCase::render(FboColorMultiTex2DCase *this,Surface *dst)

{
  ContextWrapper *this_00;
  deUint32 dVar1;
  ContextWrapper *this_01;
  bool bVar2;
  bool bVar3;
  DataType DVar4;
  deUint32 program;
  deUint32 program_00;
  deUint32 program_01;
  int iVar5;
  int iVar6;
  Context *pCVar7;
  TextureFormat *pTVar8;
  deUint32 *pdVar9;
  deUint32 *textures;
  ulong uVar10;
  deUint32 tmpTex;
  Vector<float,_4> res_1;
  Vec4 local_618;
  TextureFormat texFmt1;
  TextureFormat texFmt0;
  deUint32 tex1;
  deUint32 tex0;
  deUint32 fbo1;
  deUint32 fbo0;
  ContextWrapper *local_5e0;
  Vector<float,_4> res_3;
  void *local_5b8;
  Vec4 local_5a8;
  Surface *local_598;
  TransferFormat local_590;
  TextureFormatInfo fmtInfo1;
  TextureFormatInfo fmtInfo0;
  Texture2DShader multiTexShader;
  Texture2DShader texToFbo1Shader;
  Texture2DShader texToFbo0Shader;
  
  local_598 = dst;
  texFmt0 = glu::mapGLInternalFormat(*(deUint32 *)&(this->super_FboColorbufferCase).field_0x8c);
  texFmt1 = glu::mapGLInternalFormat(this->m_tex1Fmt);
  tcu::getTextureFormatInfo(&fmtInfo0,&texFmt0);
  tcu::getTextureFormatInfo(&fmtInfo1,&texFmt1);
  texToFbo1Shader.super_ShaderProgram.super_VertexShader._vptr_VertexShader = (_func_int **)0x0;
  texToFbo1Shader.super_ShaderProgram.super_VertexShader.m_inputs.
  super__Vector_base<rr::VertexInputInfo,_std::allocator<rr::VertexInputInfo>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  texToFbo1Shader.super_ShaderProgram.super_VertexShader.m_inputs.
  super__Vector_base<rr::VertexInputInfo,_std::allocator<rr::VertexInputInfo>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  multiTexShader.super_ShaderProgram.super_VertexShader._vptr_VertexShader =
       (_func_int **)
       CONCAT44(multiTexShader.super_ShaderProgram.super_VertexShader._vptr_VertexShader._4_4_,0x28)
  ;
  std::vector<glu::DataType,std::allocator<glu::DataType>>::_M_realloc_insert<glu::DataType_const&>
            ((vector<glu::DataType,std::allocator<glu::DataType>> *)&texToFbo1Shader,(iterator)0x0,
             (DataType *)&multiTexShader);
  DVar4 = FboTestUtil::getFragmentOutputType(&texFmt0);
  multiTexShader.super_ShaderProgram.super_VertexShader._vptr_VertexShader =
       (_func_int **)
       CONCAT44(fmtInfo0.valueMax.m_data[1] - fmtInfo0.valueMin.m_data[1],
                fmtInfo0.valueMax.m_data[0] - fmtInfo0.valueMin.m_data[0]);
  multiTexShader.super_ShaderProgram.super_VertexShader.m_inputs.
  super__Vector_base<rr::VertexInputInfo,_std::allocator<rr::VertexInputInfo>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT44(fmtInfo0.valueMax.m_data[3] - fmtInfo0.valueMin.m_data[3],
                         fmtInfo0.valueMax.m_data[2] - fmtInfo0.valueMin.m_data[2]);
  FboTestUtil::Texture2DShader::Texture2DShader
            (&texToFbo0Shader,(DataTypes *)&texToFbo1Shader,DVar4,(Vec4 *)&multiTexShader,
             &fmtInfo0.valueMin);
  if (texToFbo1Shader.super_ShaderProgram.super_VertexShader._vptr_VertexShader != (_func_int **)0x0
     ) {
    operator_delete(texToFbo1Shader.super_ShaderProgram.super_VertexShader._vptr_VertexShader,
                    (long)texToFbo1Shader.super_ShaderProgram.super_VertexShader.m_inputs.
                          super__Vector_base<rr::VertexInputInfo,_std::allocator<rr::VertexInputInfo>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)texToFbo1Shader.super_ShaderProgram.super_VertexShader._vptr_VertexShader)
    ;
  }
  multiTexShader.super_ShaderProgram.super_VertexShader._vptr_VertexShader = (_func_int **)0x0;
  multiTexShader.super_ShaderProgram.super_VertexShader.m_inputs.
  super__Vector_base<rr::VertexInputInfo,_std::allocator<rr::VertexInputInfo>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  multiTexShader.super_ShaderProgram.super_VertexShader.m_inputs.
  super__Vector_base<rr::VertexInputInfo,_std::allocator<rr::VertexInputInfo>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  res_1.m_data[0] = 5.60519e-44;
  std::vector<glu::DataType,std::allocator<glu::DataType>>::_M_realloc_insert<glu::DataType_const&>
            ((vector<glu::DataType,std::allocator<glu::DataType>> *)&multiTexShader,(iterator)0x0,
             (DataType *)&res_1);
  DVar4 = FboTestUtil::getFragmentOutputType(&texFmt1);
  res_1.m_data[1] = fmtInfo1.valueMax.m_data[1] - fmtInfo1.valueMin.m_data[1];
  res_1.m_data[0] = fmtInfo1.valueMax.m_data[0] - fmtInfo1.valueMin.m_data[0];
  res_1.m_data[3] = fmtInfo1.valueMax.m_data[3] - fmtInfo1.valueMin.m_data[3];
  res_1.m_data[2] = fmtInfo1.valueMax.m_data[2] - fmtInfo1.valueMin.m_data[2];
  FboTestUtil::Texture2DShader::Texture2DShader
            (&texToFbo1Shader,(DataTypes *)&multiTexShader,DVar4,&res_1,&fmtInfo1.valueMin);
  if (multiTexShader.super_ShaderProgram.super_VertexShader._vptr_VertexShader != (_func_int **)0x0)
  {
    operator_delete(multiTexShader.super_ShaderProgram.super_VertexShader._vptr_VertexShader,
                    (long)multiTexShader.super_ShaderProgram.super_VertexShader.m_inputs.
                          super__Vector_base<rr::VertexInputInfo,_std::allocator<rr::VertexInputInfo>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)multiTexShader.super_ShaderProgram.super_VertexShader._vptr_VertexShader);
  }
  res_1.m_data[0] = 0.0;
  res_1.m_data[1] = 0.0;
  res_1.m_data[2] = 0.0;
  res_1.m_data[3] = 0.0;
  res_3.m_data[0] = (float)glu::getSampler2DType(texFmt0);
  if (res_1.m_data._8_8_ == 0) {
    std::vector<glu::DataType,std::allocator<glu::DataType>>::
    _M_realloc_insert<glu::DataType_const&>
              ((vector<glu::DataType,std::allocator<glu::DataType>> *)&res_1,(iterator)0x0,
               (DataType *)&res_3);
  }
  else {
    *(float *)res_1.m_data._8_8_ = res_3.m_data[0];
    res_1.m_data._8_8_ = res_1.m_data._8_8_ + 4;
  }
  res_3.m_data[0] = (float)glu::getSampler2DType(texFmt1);
  if (res_1.m_data._8_8_ == 0) {
    std::vector<glu::DataType,std::allocator<glu::DataType>>::
    _M_realloc_insert<glu::DataType_const&>
              ((vector<glu::DataType,std::allocator<glu::DataType>> *)&res_1,(iterator)0x0,
               (DataType *)&res_3);
  }
  else {
    *(float *)res_1.m_data._8_8_ = res_3.m_data[0];
    res_1.m_data._8_8_ = res_1.m_data._8_8_ + 4;
  }
  res_3.m_data[0] = 1.0;
  res_3.m_data[1] = 1.0;
  res_3.m_data[2] = 1.0;
  res_3.m_data[3] = 1.0;
  local_618.m_data[0] = 0.0;
  local_618.m_data[1] = 0.0;
  local_618.m_data[2] = 0.0;
  local_618.m_data[3] = 0.0;
  FboTestUtil::Texture2DShader::Texture2DShader
            (&multiTexShader,(DataTypes *)&res_1,TYPE_FLOAT_VEC4,&res_3,&local_618);
  if (res_1.m_data._0_8_ != 0) {
    operator_delete((void *)res_1.m_data._0_8_,-res_1.m_data._0_8_);
  }
  this_00 = &(this->super_FboColorbufferCase).super_FboTestCase.super_ContextWrapper;
  pCVar7 = sglr::ContextWrapper::getCurrentContext(this_00);
  program = (*pCVar7->_vptr_Context[0x75])(pCVar7,&texToFbo0Shader);
  pCVar7 = sglr::ContextWrapper::getCurrentContext(this_00);
  program_00 = (*pCVar7->_vptr_Context[0x75])(pCVar7,&texToFbo1Shader);
  pCVar7 = sglr::ContextWrapper::getCurrentContext(this_00);
  program_01 = (*pCVar7->_vptr_Context[0x75])(pCVar7);
  res_1.m_data[1] = fmtInfo0.lookupScale.m_data[1] * 0.5;
  res_1.m_data[0] = fmtInfo0.lookupScale.m_data[0] * 0.5;
  res_1.m_data[3] = fmtInfo0.lookupScale.m_data[3] * 0.5;
  res_1.m_data[2] = fmtInfo0.lookupScale.m_data[2] * 0.5;
  res_3.m_data[1] = fmtInfo0.lookupBias.m_data[1] * 0.5;
  res_3.m_data[0] = fmtInfo0.lookupBias.m_data[0] * 0.5;
  res_3.m_data[3] = fmtInfo0.lookupBias.m_data[3] * 0.5;
  res_3.m_data[2] = fmtInfo0.lookupBias.m_data[2] * 0.5;
  FboTestUtil::Texture2DShader::setTexScaleBias(&multiTexShader,0,&res_1,&res_3);
  res_1.m_data[1] = fmtInfo1.lookupScale.m_data[1] * 0.5;
  res_1.m_data[0] = fmtInfo1.lookupScale.m_data[0] * 0.5;
  res_1.m_data[3] = fmtInfo1.lookupScale.m_data[3] * 0.5;
  res_1.m_data[2] = fmtInfo1.lookupScale.m_data[2] * 0.5;
  res_3.m_data[1] = fmtInfo1.lookupBias.m_data[1] * 0.5;
  res_3.m_data[0] = fmtInfo1.lookupBias.m_data[0] * 0.5;
  res_3.m_data[3] = fmtInfo1.lookupBias.m_data[3] * 0.5;
  res_3.m_data[2] = fmtInfo1.lookupBias.m_data[2] * 0.5;
  FboTestUtil::Texture2DShader::setTexScaleBias(&multiTexShader,1,&res_1,&res_3);
  pCVar7 = sglr::ContextWrapper::getCurrentContext(this_00);
  FboTestUtil::Texture2DShader::setUniforms(&texToFbo0Shader,pCVar7,program);
  pCVar7 = sglr::ContextWrapper::getCurrentContext(this_00);
  FboTestUtil::Texture2DShader::setUniforms(&texToFbo1Shader,pCVar7,program_00);
  pCVar7 = sglr::ContextWrapper::getCurrentContext(this_00);
  FboTestUtil::Texture2DShader::setUniforms(&multiTexShader,pCVar7,program_01);
  bVar2 = true;
  local_5e0 = this_00;
  do {
    pTVar8 = &texFmt1;
    if (bVar2) {
      pTVar8 = &texFmt0;
    }
    local_590 = glu::getTransferFormat(*pTVar8);
    uVar10 = (ulong)(byte)~bVar2;
    dVar1 = *(deUint32 *)((long)(&this->m_tex0Size + -1) + uVar10 * 4);
    bVar3 = glu::isGLInternalColorFormatFilterable(dVar1);
    pdVar9 = &fbo1;
    if (bVar2) {
      pdVar9 = &fbo0;
    }
    textures = &tex1;
    if (bVar2) {
      textures = &tex0;
    }
    sglr::ContextWrapper::glGenFramebuffers(this_00,1,pdVar9);
    sglr::ContextWrapper::glGenTextures(this_00,1,textures);
    sglr::ContextWrapper::glBindTexture(this_00,0xde1,*textures);
    sglr::ContextWrapper::glTexParameteri(this_00,0xde1,0x2802,0x812f);
    sglr::ContextWrapper::glTexParameteri(this_00,0xde1,0x2803,0x812f);
    sglr::ContextWrapper::glTexParameteri(this_00,0xde1,0x2801,bVar3 | 0x2600);
    sglr::ContextWrapper::glTexParameteri(this_00,0xde1,0x2800,bVar3 | 0x2600);
    sglr::ContextWrapper::glTexImage2D
              (this_00,0xde1,0,dVar1,(&this->m_tex0Size)[uVar10].m_data[0],
               (&this->m_tex0Size)[uVar10].m_data[1],0,local_590.format,local_590.dataType,
               (void *)0x0);
    sglr::ContextWrapper::glBindFramebuffer(this_00,0x8d40,*pdVar9);
    sglr::ContextWrapper::glFramebufferTexture2D(this_00,0x8d40,0x8ce0,0xde1,*textures,0);
    FboTestCase::checkError((FboTestCase *)this);
    FboTestCase::checkFramebufferStatus((FboTestCase *)this,0x8d40);
    this_01 = local_5e0;
    bVar3 = bVar2 != false;
    bVar2 = false;
  } while (bVar3);
  bVar2 = true;
  do {
    bVar3 = bVar2;
    tmpTex = 0;
    pdVar9 = &fbo1;
    if (bVar3) {
      pdVar9 = &fbo0;
    }
    dVar1 = *pdVar9;
    res_3.m_data._0_8_ = glu::mapGLTransferFormat(0x1908,0x1401);
    tcu::TextureLevel::TextureLevel((TextureLevel *)&res_1,(TextureFormat *)&res_3,0x80,0x80,1);
    if (bVar3) {
      tcu::TextureLevel::getAccess((PixelBufferAccess *)&res_3,(TextureLevel *)&res_1);
      local_618.m_data[0] = 0.0;
      local_618.m_data[1] = 0.0;
      local_618.m_data[2] = 0.0;
      local_618.m_data[3] = 0.0;
      local_5a8.m_data[0] = 1.0;
      local_5a8.m_data[1] = 1.0;
      local_5a8.m_data[2] = 1.0;
      local_5a8.m_data[3] = 1.0;
      tcu::fillWithComponentGradients((PixelBufferAccess *)&res_3,&local_618,&local_5a8);
    }
    else {
      tcu::TextureLevel::getAccess((PixelBufferAccess *)&res_3,(TextureLevel *)&res_1);
      local_618.m_data[0] = 0.2;
      local_618.m_data[1] = 0.7;
      local_618.m_data[2] = 0.1;
      local_618.m_data[3] = 1.0;
      local_5a8.m_data[0] = 0.7;
      local_5a8.m_data[1] = 0.1;
      local_5a8.m_data[2] = 0.5;
      local_5a8.m_data[3] = 0.8;
      tcu::fillWithGrid((PixelBufferAccess *)&res_3,8,&local_618,&local_5a8);
    }
    sglr::ContextWrapper::glGenTextures(this_01,1,&tmpTex);
    sglr::ContextWrapper::glBindTexture(this_01,0xde1,tmpTex);
    sglr::ContextWrapper::glTexParameteri(this_01,0xde1,0x2802,0x812f);
    sglr::ContextWrapper::glTexParameteri(this_01,0xde1,0x2803,0x812f);
    sglr::ContextWrapper::glTexParameteri(this_01,0xde1,0x2801,0x2601);
    sglr::ContextWrapper::glTexParameteri(this_01,0xde1,0x2800,0x2601);
    tcu::TextureLevel::getAccess((PixelBufferAccess *)&res_3,(TextureLevel *)&res_1);
    sglr::ContextWrapper::glTexImage2D(this_01,0xde1,0,0x1908,0x80,0x80,0,0x1908,0x1401,local_5b8);
    sglr::ContextWrapper::glBindFramebuffer(this_01,0x8d40,dVar1);
    sglr::ContextWrapper::glViewport
              (this_01,0,0,(&this->m_tex0Size)[(byte)~bVar3].m_data[0],
               (&this->m_tex0Size)[(byte)~bVar3].m_data[1]);
    pCVar7 = sglr::ContextWrapper::getCurrentContext(this_01);
    dVar1 = program_00;
    if (bVar3) {
      dVar1 = program;
    }
    res_3.m_data[0] = -1.0;
    res_3.m_data[1] = -1.0;
    res_3.m_data._8_8_ = res_3.m_data._8_8_ & 0xffffffff00000000;
    local_618.m_data[0] = 1.0;
    local_618.m_data[1] = 1.0;
    local_618.m_data._8_8_ = local_618.m_data._8_8_ & 0xffffffff00000000;
    sglr::drawQuad(pCVar7,dVar1,(Vec3 *)&res_3,(Vec3 *)&local_618);
    tcu::TextureLevel::~TextureLevel((TextureLevel *)&res_1);
    bVar2 = false;
  } while (bVar3);
  sglr::ContextWrapper::glBindFramebuffer(this_01,0x8d40,0);
  iVar5 = sglr::ContextWrapper::getWidth(this_01);
  iVar6 = sglr::ContextWrapper::getHeight(this_01);
  sglr::ContextWrapper::glViewport(this_01,0,0,iVar5,iVar6);
  sglr::ContextWrapper::glActiveTexture(this_01,0x84c0);
  sglr::ContextWrapper::glBindTexture(this_01,0xde1,tex0);
  sglr::ContextWrapper::glActiveTexture(this_01,0x84c1);
  sglr::ContextWrapper::glBindTexture(this_01,0xde1,tex1);
  pCVar7 = sglr::ContextWrapper::getCurrentContext(this_01);
  res_1.m_data[0] = -1.0;
  res_1.m_data[1] = -1.0;
  res_1.m_data._8_8_ = res_1.m_data._8_8_ & 0xffffffff00000000;
  res_3.m_data[0] = 1.0;
  res_3.m_data[1] = 1.0;
  res_3.m_data._8_8_ = res_3.m_data._8_8_ & 0xffffffff00000000;
  sglr::drawQuad(pCVar7,program_01,(Vec3 *)&res_1,(Vec3 *)&res_3);
  iVar5 = sglr::ContextWrapper::getWidth(this_01);
  iVar6 = sglr::ContextWrapper::getHeight(this_01);
  FboTestCase::readPixels((FboTestCase *)this,local_598,0,0,iVar5,iVar6);
  FboTestUtil::Texture2DShader::~Texture2DShader(&multiTexShader);
  FboTestUtil::Texture2DShader::~Texture2DShader(&texToFbo1Shader);
  FboTestUtil::Texture2DShader::~Texture2DShader(&texToFbo0Shader);
  return;
}

Assistant:

void render (tcu::Surface& dst)
	{
		tcu::TextureFormat		texFmt0			= glu::mapGLInternalFormat(m_tex0Fmt);
		tcu::TextureFormat		texFmt1			= glu::mapGLInternalFormat(m_tex1Fmt);
		tcu::TextureFormatInfo	fmtInfo0		= tcu::getTextureFormatInfo(texFmt0);
		tcu::TextureFormatInfo	fmtInfo1		= tcu::getTextureFormatInfo(texFmt1);

		Texture2DShader			texToFbo0Shader	(DataTypes() << glu::TYPE_SAMPLER_2D, getFragmentOutputType(texFmt0), fmtInfo0.valueMax-fmtInfo0.valueMin, fmtInfo0.valueMin);
		Texture2DShader			texToFbo1Shader	(DataTypes() << glu::TYPE_SAMPLER_2D, getFragmentOutputType(texFmt1), fmtInfo1.valueMax-fmtInfo1.valueMin, fmtInfo1.valueMin);
		Texture2DShader			multiTexShader	(DataTypes() << glu::getSampler2DType(texFmt0) << glu::getSampler2DType(texFmt1), glu::TYPE_FLOAT_VEC4);

		deUint32				texToFbo0ShaderID = getCurrentContext()->createProgram(&texToFbo0Shader);
		deUint32				texToFbo1ShaderID = getCurrentContext()->createProgram(&texToFbo1Shader);
		deUint32				multiTexShaderID  = getCurrentContext()->createProgram(&multiTexShader);

		// Setup shaders
		multiTexShader.setTexScaleBias(0, fmtInfo0.lookupScale * 0.5f, fmtInfo0.lookupBias * 0.5f);
		multiTexShader.setTexScaleBias(1, fmtInfo1.lookupScale * 0.5f, fmtInfo1.lookupBias * 0.5f);
		texToFbo0Shader.setUniforms(*getCurrentContext(), texToFbo0ShaderID);
		texToFbo1Shader.setUniforms(*getCurrentContext(), texToFbo1ShaderID);
		multiTexShader.setUniforms (*getCurrentContext(), multiTexShaderID);

		// Framebuffers.
		deUint32				fbo0, fbo1;
		deUint32				tex0, tex1;

		for (int ndx = 0; ndx < 2; ndx++)
		{
			glu::TransferFormat		transferFmt		= glu::getTransferFormat(ndx ? texFmt1 : texFmt0);
			deUint32				format			= ndx ? m_tex1Fmt : m_tex0Fmt;
			bool					isFilterable	= glu::isGLInternalColorFormatFilterable(format);
			const IVec2&			size			= ndx ? m_tex1Size : m_tex0Size;
			deUint32&				fbo				= ndx ? fbo1 : fbo0;
			deUint32&				tex				= ndx ? tex1 : tex0;

			glGenFramebuffers(1, &fbo);
			glGenTextures(1, &tex);

			glBindTexture(GL_TEXTURE_2D, tex);
			glTexParameteri(GL_TEXTURE_2D,	GL_TEXTURE_WRAP_S,		GL_CLAMP_TO_EDGE);
			glTexParameteri(GL_TEXTURE_2D,	GL_TEXTURE_WRAP_T,		GL_CLAMP_TO_EDGE);
			glTexParameteri(GL_TEXTURE_2D,	GL_TEXTURE_MIN_FILTER,	isFilterable ? GL_LINEAR : GL_NEAREST);
			glTexParameteri(GL_TEXTURE_2D,	GL_TEXTURE_MAG_FILTER,	isFilterable ? GL_LINEAR : GL_NEAREST);
			glTexImage2D(GL_TEXTURE_2D, 0, format, size.x(), size.y(), 0, transferFmt.format, transferFmt.dataType, DE_NULL);

			glBindFramebuffer(GL_FRAMEBUFFER, fbo);
			glFramebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, tex, 0);
			checkError();
			checkFramebufferStatus(GL_FRAMEBUFFER);
		}

		// Render textures to both framebuffers.
		for (int ndx = 0; ndx < 2; ndx++)
		{
			const deUint32		format		= GL_RGBA;
			const deUint32		dataType	= GL_UNSIGNED_BYTE;
			const int			texW		= 128;
			const int			texH		= 128;
			deUint32			tmpTex		= 0;
			deUint32			fbo			= ndx ? fbo1 : fbo0;
			const IVec2&		viewport	= ndx ? m_tex1Size : m_tex0Size;
			tcu::TextureLevel	data		(glu::mapGLTransferFormat(format, dataType), texW, texH, 1);

			if (ndx == 0)
				tcu::fillWithComponentGradients(data.getAccess(), Vec4(0.0f), Vec4(1.0f));
			else
				tcu::fillWithGrid(data.getAccess(), 8, Vec4(0.2f, 0.7f, 0.1f, 1.0f), Vec4(0.7f, 0.1f, 0.5f, 0.8f));

			glGenTextures(1, &tmpTex);
			glBindTexture(GL_TEXTURE_2D, tmpTex);
			glTexParameteri(GL_TEXTURE_2D,	GL_TEXTURE_WRAP_S,		GL_CLAMP_TO_EDGE);
			glTexParameteri(GL_TEXTURE_2D,	GL_TEXTURE_WRAP_T,		GL_CLAMP_TO_EDGE);
			glTexParameteri(GL_TEXTURE_2D,	GL_TEXTURE_MIN_FILTER,	GL_LINEAR);
			glTexParameteri(GL_TEXTURE_2D,	GL_TEXTURE_MAG_FILTER,	GL_LINEAR);
			glTexImage2D(GL_TEXTURE_2D, 0, format, texW, texH, 0, format, dataType, data.getAccess().getDataPtr());

			glBindFramebuffer(GL_FRAMEBUFFER, fbo);
			glViewport(0, 0, viewport.x(), viewport.y());
			sglr::drawQuad(*getCurrentContext(), ndx ? texToFbo1ShaderID : texToFbo0ShaderID, Vec3(-1.0f, -1.0f, 0.0f), Vec3(1.0f, 1.0f, 0.0f));
		}

		// Render to framebuffer.
		glBindFramebuffer(GL_FRAMEBUFFER, 0);
		glViewport(0, 0, getWidth(), getHeight());
		glActiveTexture(GL_TEXTURE0);
		glBindTexture(GL_TEXTURE_2D, tex0);
		glActiveTexture(GL_TEXTURE1);
		glBindTexture(GL_TEXTURE_2D, tex1);
		sglr::drawQuad(*getCurrentContext(), multiTexShaderID, Vec3(-1.0f, -1.0f, 0.0f), Vec3(1.0f, 1.0f, 0.0f));

		readPixels(dst, 0, 0, getWidth(), getHeight());
	}